

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void write_file_u32(vector<unsigned_int,_std::allocator<unsigned_int>_> *nums,string *file_name)

{
  pointer __ptr;
  FILE *__s;
  size_t sVar1;
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)file_name);
  __s = (FILE *)fopen_or_fail(&sStack_38,"wb");
  std::__cxx11::string::~string((string *)&sStack_38);
  __ptr = (nums->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start;
  sVar1 = fwrite(__ptr,4,(long)(nums->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)__ptr >> 2,__s);
  if (sVar1 == (long)(nums->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(nums->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                     .super__Vector_impl_data._M_start >> 2) {
    fclose_or_fail((FILE *)__s);
    return;
  }
  quit("reading file content failed: %d",sVar1);
}

Assistant:

void write_file_u32(std::vector<uint32_t>& nums, std::string file_name)
{
    auto f = fopen_or_fail(file_name, "wb");
    auto ret = fwrite(nums.data(), sizeof(uint32_t), nums.size(), f);
    if (ret != nums.size()) {
        quit("reading file content failed: %d", ret);
    }
    fclose_or_fail(f);
}